

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Observer.cpp
# Opt level: O1

void longf(float f)

{
  spin_mutex_t sVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"longf begin: ",0xd);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," with f=",8);
  poVar3 = std::ostream::_M_insert<double>((double)f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," x=",3);
  plVar4 = (long *)std::ostream::operator<<(poVar3,x);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  x = x << 1;
  mywait(f);
  x = x << 1;
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"longf end: ",0xb);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," with f=",8);
  poVar3 = std::ostream::_M_insert<double>((double)f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," x=",3);
  plVar4 = (long *)std::ostream::operator<<(poVar3,x);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  return;
}

Assistant:

void longf(float f) {
  LOG("longf begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with f=" << f << " x=" << x);
  
  x = x * 2;
  
  mywait(f);
  
  x = x * 2;
  
  LOG("longf end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with f=" << f << " x=" << x);
}